

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncLogging.cc
# Opt level: O0

void __thiscall
tt::AsyncLogging::AsyncLogging(AsyncLogging *this,string *basename,int flushInterval)

{
  FixedBuffer<4000000> *pFVar1;
  ulong uVar2;
  element_type *peVar3;
  size_t __n;
  size_t __n_00;
  void *__s;
  allocator local_a1;
  string local_a0 [48];
  AsyncLogging *local_70;
  code *local_68;
  undefined8 local_60;
  type local_58;
  ThreadFunc local_40;
  int local_1c;
  string *psStack_18;
  int flushInterval_local;
  string *basename_local;
  AsyncLogging *this_local;
  
  this->m_flushInterval = flushInterval;
  this->m_running = false;
  local_1c = flushInterval;
  psStack_18 = basename;
  basename_local = (string *)this;
  std::__cxx11::string::string((string *)&this->m_basename,(string *)basename);
  local_68 = threadFunc;
  local_60 = 0;
  local_70 = this;
  std::bind<void(tt::AsyncLogging::*)(),tt::AsyncLogging*>
            (&local_58,(offset_in_AsyncLogging_to_subr *)&local_68,&local_70);
  std::function<void()>::function<std::_Bind<void(tt::AsyncLogging::*(tt::AsyncLogging*))()>,void>
            ((function<void()> *)&local_40,&local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"Logging",&local_a1);
  Thread::Thread(&this->m_thread,&local_40,(string *)local_a0);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::function<void_()>::~function(&local_40);
  CountDownLatch::CountDownLatch(&this->m_latch,1);
  MutexLock::MutexLock(&this->m_mutex);
  Condition::Condition(&this->m_cond,&this->m_mutex);
  pFVar1 = (FixedBuffer<4000000> *)operator_new(0x3d0908);
  detail::FixedBuffer<4000000>::FixedBuffer(pFVar1);
  std::shared_ptr<tt::detail::FixedBuffer<4000000>>::
  shared_ptr<tt::detail::FixedBuffer<4000000>,void>
            ((shared_ptr<tt::detail::FixedBuffer<4000000>> *)&this->m_currentBuffer,pFVar1);
  pFVar1 = (FixedBuffer<4000000> *)operator_new(0x3d0908);
  detail::FixedBuffer<4000000>::FixedBuffer(pFVar1);
  std::shared_ptr<tt::detail::FixedBuffer<4000000>>::
  shared_ptr<tt::detail::FixedBuffer<4000000>,void>
            ((shared_ptr<tt::detail::FixedBuffer<4000000>> *)&this->m_nextBuffer,pFVar1);
  __s = (void *)0x0;
  memset(&this->m_buffers,0,0x18);
  std::
  vector<std::shared_ptr<tt::detail::FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<tt::detail::FixedBuffer<4000000>_>_>_>
  ::vector(&this->m_buffers);
  uVar2 = std::__cxx11::string::size();
  if (1 < uVar2) {
    peVar3 = std::
             __shared_ptr_access<tt::detail::FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<tt::detail::FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_currentBuffer);
    detail::FixedBuffer<4000000>::bzero(peVar3,__s,__n);
    peVar3 = std::
             __shared_ptr_access<tt::detail::FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<tt::detail::FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_nextBuffer);
    detail::FixedBuffer<4000000>::bzero(peVar3,__s,__n_00);
    std::
    vector<std::shared_ptr<tt::detail::FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<tt::detail::FixedBuffer<4000000>_>_>_>
    ::reserve(&this->m_buffers,0x10);
    return;
  }
  __assert_fail("basename.size() > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/HhTtLllL[P]web_server/h_webserver/base/AsyncLogging.cc"
                ,0x16,"tt::AsyncLogging::AsyncLogging(const std::string &, int)");
}

Assistant:

AsyncLogging::AsyncLogging(const std::string& basename, int flushInterval)
	:m_flushInterval(flushInterval),
	m_running(false),
	m_basename(basename),
	m_thread(std::bind(&AsyncLogging::threadFunc,this),"Logging"),
	m_latch(1),
	m_mutex(),
	m_cond(m_mutex),
	m_currentBuffer(new Buffer),
	m_nextBuffer(new Buffer),
	m_buffers(){

		assert(basename.size() > 1);

		m_currentBuffer->bzero();
		m_nextBuffer->bzero();
		m_buffers.reserve(16);

}